

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_fast(char *source,char *dest,int originalSize)

{
  bool bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort *puVar4;
  ulong uVar5;
  size_t l_1;
  char *pcVar6;
  ulong uVar7;
  ushort *__src;
  uint uVar8;
  size_t l;
  long lVar9;
  ulong uVar10;
  char *__dest;
  char cVar11;
  int local_40;
  
  pcVar6 = dest + originalSize;
  puVar4 = (ushort *)source;
  __dest = dest;
  do {
    uVar2 = *puVar4;
    __src = (ushort *)((long)puVar4 + 1);
    uVar8 = (uint)(byte)((byte)uVar2 >> 4);
    uVar10 = (ulong)uVar8;
    if (uVar8 == 0xf) {
      lVar9 = 0;
      do {
        uVar3 = *__src;
        __src = (ushort *)((long)__src + 1);
        lVar9 = lVar9 + (ulong)(byte)uVar3;
      } while ((ulong)(byte)uVar3 == 0xff);
      uVar10 = lVar9 + 0xf;
    }
    cVar11 = '\0';
    if ((ulong)((long)pcVar6 - (long)__dest) < uVar10) {
      cVar11 = '\x01';
LAB_0010e3bc:
      bVar1 = false;
    }
    else {
      memmove(__dest,__src,uVar10);
      __dest = __dest + uVar10;
      __src = (ushort *)((long)__src + uVar10);
      bVar1 = true;
      if ((ulong)((long)pcVar6 - (long)__dest) < 0xc) {
        cVar11 = (__dest == pcVar6) * '\x02' + '\x01';
        goto LAB_0010e3bc;
      }
    }
    puVar4 = __src;
    if (bVar1) {
      uVar10 = (ulong)((byte)uVar2 & 0xf);
      puVar4 = __src + 1;
      if (uVar10 == 0xf) {
        lVar9 = 0;
        do {
          uVar2 = *puVar4;
          puVar4 = (ushort *)((long)puVar4 + 1);
          lVar9 = lVar9 + (ulong)(byte)uVar2;
        } while ((ulong)(byte)uVar2 == 0xff);
        uVar10 = lVar9 + 0xf;
      }
      uVar10 = uVar10 + 4;
      cVar11 = '\x01';
      if (uVar10 <= (ulong)((long)pcVar6 - (long)__dest)) {
        uVar5 = (ulong)*__src;
        if (uVar5 <= (ulong)((long)__dest - (long)dest)) {
          if (uVar10 != 0) {
            uVar7 = 0;
            do {
              __dest[uVar7] = __dest[uVar7 - uVar5];
              uVar7 = uVar7 + 1;
            } while (uVar10 != uVar7);
          }
          if (uVar5 <= (ulong)((long)__dest - (long)dest)) {
            __dest = __dest + uVar10;
            cVar11 = (ulong)((long)pcVar6 - (long)__dest) < 5;
          }
        }
      }
    }
    if (cVar11 != '\0') {
      if (cVar11 == '\x03') {
        local_40 = (int)source;
        local_40 = (int)puVar4 - local_40;
      }
      else {
        local_40 = -1;
      }
      return local_40;
    }
  } while( true );
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_fast(const char* source, char* dest, int originalSize)
{
    DEBUGLOG(5, "LZ4_decompress_fast");
    return LZ4_decompress_unsafe_generic(
                (const BYTE*)source, (BYTE*)dest, originalSize,
                0, NULL, 0);
}